

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O0

Generator<std::tuple<Rectangle>_> cppqc::tupleOf<Rectangle>(Generator<Rectangle> *g)

{
  __uniq_ptr_impl<cppqc::detail::GenConcept<std::tuple<Rectangle>_>,_std::default_delete<cppqc::detail::GenConcept<std::tuple<Rectangle>_>_>_>
  in_RDI;
  Generator<Rectangle> *in_stack_ffffffffffffffb8;
  TupleGenerator<Rectangle> *in_stack_ffffffffffffffd8;
  Generator<std::tuple<Rectangle>_> *in_stack_ffffffffffffffe0;
  
  detail::TupleGenerator<Rectangle>::TupleGenerator
            ((TupleGenerator<Rectangle> *)
             in_RDI._M_t.
             super__Tuple_impl<0UL,_cppqc::detail::GenConcept<std::tuple<Rectangle>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::tuple<Rectangle>_>_>_>
             .super__Head_base<0UL,_cppqc::detail::GenConcept<std::tuple<Rectangle>_>_*,_false>.
             _M_head_impl,in_stack_ffffffffffffffb8);
  Generator<std::tuple<Rectangle>>::Generator<cppqc::detail::TupleGenerator<Rectangle>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  detail::TupleGenerator<Rectangle>::~TupleGenerator((TupleGenerator<Rectangle> *)0x116d6a);
  return (unique_ptr<cppqc::detail::GenConcept<std::tuple<Rectangle>_>,_std::default_delete<cppqc::detail::GenConcept<std::tuple<Rectangle>_>_>_>
          )(unique_ptr<cppqc::detail::GenConcept<std::tuple<Rectangle>_>,_std::default_delete<cppqc::detail::GenConcept<std::tuple<Rectangle>_>_>_>
            )in_RDI._M_t.
             super__Tuple_impl<0UL,_cppqc::detail::GenConcept<std::tuple<Rectangle>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::tuple<Rectangle>_>_>_>
             .super__Head_base<0UL,_cppqc::detail::GenConcept<std::tuple<Rectangle>_>_*,_false>.
             _M_head_impl;
}

Assistant:

Generator<std::tuple<T...>> tupleOf(const Generator<T>&... g) {
  return detail::TupleGenerator<T...>(g...);
}